

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

void __thiscall Vault::Client::~Client(Client *this)

{
  this->_vptr_Client = (_func_int **)&PTR__Client_001c5990;
  std::filesystem::__cxx11::path::~path(&this->caBundle_);
  HttpClient::~HttpClient(&this->httpClient_);
  std::__cxx11::string::~string((string *)&this->namespace_);
  std::__cxx11::string::~string((string *)&this->token_);
  std::__cxx11::string::~string((string *)&this->port_);
  std::__cxx11::string::~string((string *)&this->host_);
  return;
}

Assistant:

virtual ~Client() = default;